

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_palloc.c
# Opt level: O2

void ngx_pool_run_cleanup_file(ngx_pool_t *p,ngx_fd_t fd)

{
  ngx_pool_cleanup_t *pnVar1;
  ngx_pool_cleanup_t **ppnVar2;
  
  ppnVar2 = &p->cleanup;
  while( true ) {
    pnVar1 = *ppnVar2;
    if (pnVar1 == (ngx_pool_cleanup_t *)0x0) {
      return;
    }
    if ((pnVar1->handler == ngx_pool_cleanup_file) && (*pnVar1->data == fd)) break;
    ppnVar2 = &pnVar1->next;
  }
  ngx_pool_cleanup_file(pnVar1->data);
  pnVar1->handler = (ngx_pool_cleanup_pt)0x0;
  return;
}

Assistant:

void
ngx_pool_run_cleanup_file(ngx_pool_t *p, ngx_fd_t fd)
{
    ngx_pool_cleanup_t       *c;
    ngx_pool_cleanup_file_t  *cf;

    for (c = p->cleanup; c; c = c->next) {
        if (c->handler == ngx_pool_cleanup_file) {

            cf = c->data;

            if (cf->fd == fd) {
                c->handler(cf);
                c->handler = NULL;
                return;
            }
        }
    }
}